

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::VerifySignRequest,cfd::js::api::json::VerifySignResponse,cfd::js::api::VerifySignRequestStruct,cfd::js::api::VerifySignResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
          *elements_function)

{
  ErrorResponse local_6b8;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_600 [4];
  JsonClassBase<cfd::js::api::json::VerifySignResponse> local_5e0 [4];
  undefined1 local_5c0 [8];
  VerifySignResponse res_2;
  VerifySignResponseStruct local_558;
  VerifySignResponseStruct local_490;
  undefined1 local_3c8 [8];
  VerifySignResponseStruct response;
  VerifySignRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_a8 [8];
  VerifySignRequest req;
  function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
  *elements_function_local;
  function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
  *bitcoin_function_local;
  string *request_message_local;
  string *json_message;
  
  req.txins_.super_JsonVector<cfd::js::api::json::VerifySignTxInUtxoData>.
  super_vector<cfd::js::api::json::VerifySignTxInUtxoData,_std::allocator<cfd::js::api::json::VerifySignTxInUtxoData>_>
  .
  super__Vector_base<cfd::js::api::json::VerifySignTxInUtxoData,_std::allocator<cfd::js::api::json::VerifySignTxInUtxoData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)elements_function;
  VerifySignRequest::VerifySignRequest((VerifySignRequest *)local_a8);
  core::JsonClassBase<cfd::js::api::json::VerifySignRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::VerifySignRequest> *)local_a8,request_message);
  VerifySignRequest::ConvertToStruct
            ((VerifySignRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (VerifySignRequest *)local_a8);
  VerifySignResponseStruct::VerifySignResponseStruct((VerifySignResponseStruct *)local_3c8);
  if ((request._24_1_ & 1) == 0) {
    std::
    function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
    ::operator()(&local_558,bitcoin_function,
                 (VerifySignRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    VerifySignResponseStruct::operator=((VerifySignResponseStruct *)local_3c8,&local_558);
    VerifySignResponseStruct::~VerifySignResponseStruct(&local_558);
  }
  else {
    std::
    function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
    ::operator()(&local_490,elements_function,
                 (VerifySignRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    VerifySignResponseStruct::operator=((VerifySignResponseStruct *)local_3c8,&local_490);
    VerifySignResponseStruct::~VerifySignResponseStruct(&local_490);
  }
  res_2.fail_txins_.super_JsonVector<cfd::js::api::json::FailSignTxIn>.
  super_vector<cfd::js::api::json::FailSignTxIn,_std::allocator<cfd::js::api::json::FailSignTxIn>_>.
  super__Vector_base<cfd::js::api::json::FailSignTxIn,_std::allocator<cfd::js::api::json::FailSignTxIn>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if ((int)response.fail_txins.
           super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
    VerifySignResponse::VerifySignResponse((VerifySignResponse *)local_5c0);
    VerifySignResponse::ConvertFromStruct
              ((VerifySignResponse *)local_5c0,(VerifySignResponseStruct *)local_3c8);
    core::JsonClassBase<cfd::js::api::json::VerifySignResponse>::Serialize_abi_cxx11_(local_5e0);
    std::__cxx11::string::operator=((string *)this,(string *)local_5e0);
    std::__cxx11::string::~string((string *)local_5e0);
    VerifySignResponse::~VerifySignResponse((VerifySignResponse *)local_5c0);
  }
  else {
    ErrorResponse::ConvertFromStruct
              (&local_6b8,
               (InnerErrorResponseStruct *)
               &response.fail_txins.
                super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_600);
    std::__cxx11::string::operator=((string *)this,(string *)local_600);
    std::__cxx11::string::~string((string *)local_600);
    ErrorResponse::~ErrorResponse(&local_6b8);
  }
  res_2.fail_txins_.super_JsonVector<cfd::js::api::json::FailSignTxIn>.
  super_vector<cfd::js::api::json::FailSignTxIn,_std::allocator<cfd::js::api::json::FailSignTxIn>_>.
  super__Vector_base<cfd::js::api::json::FailSignTxIn,_std::allocator<cfd::js::api::json::FailSignTxIn>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  VerifySignResponseStruct::~VerifySignResponseStruct((VerifySignResponseStruct *)local_3c8);
  VerifySignRequestStruct::~VerifySignRequestStruct
            ((VerifySignRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  VerifySignRequest::~VerifySignRequest((VerifySignRequest *)local_a8);
  return this;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}